

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicsObject.cpp
# Opt level: O2

Var Js::AtomicsObject::EntryNotify(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  uint32 nValue;
  undefined4 *puVar8;
  Var pvVar9;
  Var index;
  TypedArrayBase *pTVar10;
  undefined4 extraout_var;
  WaiterList *this;
  uint index_00;
  int32 count;
  double value;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  ArgumentReader args;
  AutoCriticalSection autoCS;
  uint32 local_34 [2];
  uint32 accessIndex;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xed,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a04db0;
    *puVar8 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&callInfo_local,&local_60,(Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xed,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a04db0;
    *puVar8 = 0;
  }
  if ((callInfo_local._0_4_ & 0xffffff) < 3) {
    JavascriptError::ThrowRangeError(pSVar1,-0x7ff5ec12,L"Atomics.notify");
  }
  local_34[0] = 0;
  pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,1);
  index = Arguments::operator[]((Arguments *)&callInfo_local,2);
  pTVar10 = ValidateAndGetTypedArray(pvVar9,index,local_34,pSVar1,true);
  count = 0x7fffffff;
  if ((callInfo_local._0_4_ & 0xfffffc) != 0) {
    pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,3);
    BVar4 = JavascriptOperators::IsUndefinedObject(pvVar9);
    if (BVar4 == 0) {
      pvVar9 = Arguments::operator[]((Arguments *)&callInfo_local,3);
      value = JavascriptConversion::ToInteger(pvVar9,pSVar1);
      bVar3 = NumberUtilities::IsNan(value);
      if (!bVar3) {
        bVar3 = JavascriptNumber::IsPosInf(value);
        if (!bVar3) {
          iVar5 = JavascriptConversion::ToInt32(value);
          count = 0;
          if (0 < iVar5) {
            count = iVar5;
          }
        }
      }
    }
  }
  if (pTVar10->BYTES_PER_ELEMENT != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xfc,"(typedArrayBase->GetBytesPerElement() == 4)",
                                "typedArrayBase->GetBytesPerElement() == 4");
    if (!bVar3) goto LAB_00a04db0;
    *puVar8 = 0;
  }
  index_00 = local_34[0] * 4 + pTVar10->byteOffset;
  uVar6 = (*(((pTVar10->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x71])();
  if (uVar6 <= index_00) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/AtomicsObject.cpp"
                                ,0xfe,
                                "(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength())",
                                "bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength()");
    if (!bVar3) {
LAB_00a04db0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  iVar7 = (*(((pTVar10->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6f])();
  this = SharedArrayBuffer::GetWaiterList
                   ((SharedArrayBuffer *)CONCAT44(extraout_var,iVar7),index_00);
  args.super_Arguments.Values = (Type)&this->csForAccess;
  CCLock::Enter((CCLock *)args.super_Arguments.Values);
  nValue = WaiterList::RemoveAndWakeWaiters(this,count);
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&args.super_Arguments.Values);
  pvVar9 = JavascriptNumber::ToVar(nValue,pSVar1);
  return pvVar9;
}

Assistant:

Var AtomicsObject::EntryNotify(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ATOMICS_FUNCTION_ENTRY_CHECKS(2, "Atomics.notify");

        uint32 accessIndex = 0;
        TypedArrayBase *typedArrayBase = ValidateAndGetTypedArray(args[1], args[2], &accessIndex, scriptContext, true /*onlyInt32*/);
        int32 count = INT_MAX;
        if (args.Info.Count > 3 && !JavascriptOperators::IsUndefinedObject(args[3]))
        {
            double d = JavascriptConversion::ToInteger(args[3], scriptContext);
            if (!(NumberUtilities::IsNan(d) || JavascriptNumber::IsPosInf(d)))
            {
                int32 c = JavascriptConversion::ToInt32(d);
                count = max(0, c);
            }
        }

        Assert(typedArrayBase->GetBytesPerElement() == 4);
        uint32 bufferIndex = (accessIndex * 4) + typedArrayBase->GetByteOffset();
        Assert(bufferIndex < typedArrayBase->GetArrayBuffer()->GetByteLength());
        SharedArrayBuffer *sharedArrayBuffer = typedArrayBase->GetArrayBuffer()->GetAsSharedArrayBuffer();
        WaiterList *waiterList = sharedArrayBuffer->GetWaiterList(bufferIndex);

        uint32 removed = 0;
        {
            AutoCriticalSection autoCS(waiterList->GetCriticalSectionForAccess());
            removed = waiterList->RemoveAndWakeWaiters(count);
        }

        return JavascriptNumber::ToVar(removed, scriptContext);
    }